

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_sort.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ListSortBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments,OrderType *order,OrderByNullType *null_order)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  undefined8 uVar2;
  bool bVar3;
  reference pvVar4;
  pointer pEVar5;
  reference pvVar6;
  LogicalType *pLVar7;
  bool local_71;
  undefined1 local_70 [40];
  LogicalType child_type;
  
  local_70._32_8_ = null_order;
  LogicalType::LogicalType(&child_type);
  pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar4);
  LogicalType::LogicalType((LogicalType *)local_70,UNKNOWN);
  bVar3 = LogicalType::operator==(&pEVar5->return_type,(LogicalType *)local_70);
  LogicalType::~LogicalType((LogicalType *)local_70);
  if (bVar3) {
    LogicalType::LogicalType((LogicalType *)local_70,UNKNOWN);
    pvVar6 = vector<duckdb::LogicalType,_true>::get<true>
                       (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,0
                       );
    LogicalType::operator=(pvVar6,(LogicalType *)local_70);
    LogicalType::~LogicalType((LogicalType *)local_70);
    LogicalType::LogicalType((LogicalType *)local_70,SQLNULL);
    pLVar7 = &(bound_function->super_BaseScalarFunction).return_type;
    LogicalType::operator=(pLVar7,(LogicalType *)local_70);
    LogicalType::~LogicalType((LogicalType *)local_70);
    LogicalType::operator=(&child_type,pLVar7);
    local_71 = false;
    make_uniq<duckdb::ListSortBindData,duckdb::OrderType&,duckdb::OrderByNullType&,bool,duckdb::LogicalType&,duckdb::LogicalType&,duckdb::ClientContext&>
              ((duckdb *)local_70,order,(OrderByNullType *)local_70._32_8_,&local_71,pLVar7,
               &child_type,context);
  }
  else {
    pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    local_70._24_8_ =
         (pvVar4->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pvVar4->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    BoundCastExpression::AddArrayCastToList
              ((BoundCastExpression *)local_70,context,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               (local_70 + 0x18));
    pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    uVar2 = local_70._0_8_;
    local_70._0_8_ = (_func_int **)0x0;
    _Var1._M_head_impl =
         (pvVar4->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pvVar4->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar2;
    if (_Var1._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
    }
    if ((_func_int **)local_70._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_70._0_8_ + 8))();
    }
    local_70._0_8_ = (Expression *)0x0;
    if ((Expression *)local_70._24_8_ != (Expression *)0x0) {
      (*((BaseExpression *)local_70._24_8_)->_vptr_BaseExpression[1])();
    }
    local_70._24_8_ = 0;
    pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar4);
    pLVar7 = ListType::GetChildType(&pEVar5->return_type);
    LogicalType::operator=(&child_type,pLVar7);
    pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar4);
    pvVar6 = vector<duckdb::LogicalType,_true>::get<true>
                       (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,0
                       );
    LogicalType::operator=(pvVar6,&pEVar5->return_type);
    pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar4);
    pLVar7 = &(bound_function->super_BaseScalarFunction).return_type;
    LogicalType::operator=(pLVar7,&pEVar5->return_type);
    local_71 = false;
    make_uniq<duckdb::ListSortBindData,duckdb::OrderType&,duckdb::OrderByNullType&,bool,duckdb::LogicalType&,duckdb::LogicalType&,duckdb::ClientContext&>
              ((duckdb *)local_70,order,(OrderByNullType *)local_70._32_8_,&local_71,pLVar7,
               &child_type,context);
  }
  *(undefined8 *)this = local_70._0_8_;
  LogicalType::~LogicalType(&child_type);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> ListSortBind(ClientContext &context, ScalarFunction &bound_function,
                                             vector<unique_ptr<Expression>> &arguments, OrderType &order,
                                             OrderByNullType &null_order) {

	LogicalType child_type;
	if (arguments[0]->return_type == LogicalTypeId::UNKNOWN) {
		bound_function.arguments[0] = LogicalTypeId::UNKNOWN;
		bound_function.return_type = LogicalType::SQLNULL;
		child_type = bound_function.return_type;
		return make_uniq<ListSortBindData>(order, null_order, false, bound_function.return_type, child_type, context);
	}

	arguments[0] = BoundCastExpression::AddArrayCastToList(context, std::move(arguments[0]));
	child_type = ListType::GetChildType(arguments[0]->return_type);

	bound_function.arguments[0] = arguments[0]->return_type;
	bound_function.return_type = arguments[0]->return_type;

	return make_uniq<ListSortBindData>(order, null_order, false, bound_function.return_type, child_type, context);
}